

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O2

cbtDbvtNode * removeleaf(cbtDbvt *pdbvt,cbtDbvtNode *leaf)

{
  cbtDbvtNode *pcVar1;
  bool bVar2;
  cbtDbvtNode *r;
  cbtDbvtNode *pcVar3;
  cbtDbvtVolume pb;
  cbtDbvtAabbMm local_38;
  
  if (pdbvt->m_root == leaf) {
    pdbvt->m_root = (cbtDbvtNode *)0x0;
    pcVar3 = (cbtDbvtNode *)0x0;
  }
  else {
    pcVar3 = leaf->parent;
    r = pcVar3->parent;
    pcVar1 = *(cbtDbvtNode **)
              ((long)(&pcVar3->volume + 1) + ((ulong)((pcVar3->field_2).childs[1] != leaf) + 1) * 8)
    ;
    if (r == (cbtDbvtNode *)0x0) {
      pdbvt->m_root = pcVar1;
      pcVar1->parent = (cbtDbvtNode *)0x0;
      deletenode(pdbvt,pcVar3);
    }
    else {
      *(cbtDbvtNode **)
       ((long)(&r->volume + 1) + ((ulong)((r->field_2).childs[1] == pcVar3) + 1) * 8) = pcVar1;
      pcVar1->parent = r;
      deletenode(pdbvt,pcVar3);
      for (; r != (cbtDbvtNode *)0x0; r = r->parent) {
        local_38.mi.m_floats._0_8_ = *(undefined8 *)(r->volume).mi.m_floats;
        local_38.mi.m_floats._8_8_ = *(undefined8 *)((r->volume).mi.m_floats + 2);
        local_38.mx.m_floats._0_8_ = *(undefined8 *)(r->volume).mx.m_floats;
        local_38.mx.m_floats._8_8_ = *(undefined8 *)((r->volume).mx.m_floats + 2);
        Merge(&(r->field_2).childs[0]->volume,&(r->field_2).childs[1]->volume,&r->volume);
        bVar2 = NotEqual(&local_38,&r->volume);
        if (!bVar2) {
          return r;
        }
      }
    }
    pcVar3 = pdbvt->m_root;
  }
  return pcVar3;
}

Assistant:

static cbtDbvtNode* removeleaf(cbtDbvt* pdbvt,
							  cbtDbvtNode* leaf)
{
	if (leaf == pdbvt->m_root)
	{
		pdbvt->m_root = 0;
		return (0);
	}
	else
	{
		cbtDbvtNode* parent = leaf->parent;
		cbtDbvtNode* prev = parent->parent;
		cbtDbvtNode* sibling = parent->childs[1 - indexof(leaf)];
		if (prev)
		{
			prev->childs[indexof(parent)] = sibling;
			sibling->parent = prev;
			deletenode(pdbvt, parent);
			while (prev)
			{
				const cbtDbvtVolume pb = prev->volume;
				Merge(prev->childs[0]->volume, prev->childs[1]->volume, prev->volume);
				if (NotEqual(pb, prev->volume))
				{
					prev = prev->parent;
				}
				else
					break;
			}
			return (prev ? prev : pdbvt->m_root);
		}
		else
		{
			pdbvt->m_root = sibling;
			sibling->parent = 0;
			deletenode(pdbvt, parent);
			return (pdbvt->m_root);
		}
	}
}